

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_write_string(FILE *f,char *str,char *errmsg)

{
  size_t sVar1;
  
  sVar1 = strlen(str);
  if (sVar1 < 0xffffffff) {
    mcpl_write_buffer(f,(uint32_t)sVar1,str,errmsg);
    return;
  }
  mcpl_error("too large string encountered ");
}

Assistant:

MCPL_LOCAL void mcpl_write_string(FILE* f, const char * str, const char * errmsg)
{
  size_t n = strlen(str);
  if ( n >= 4294967295 )
    mcpl_error("too large string encountered ");
  mcpl_write_buffer(f,(uint32_t)n,str,errmsg);//nb: we don't write the terminating null-char
}